

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

Ptr __thiscall soul::SourceCodeText::createInternal(SourceCodeText *this,string *name,string *text)

{
  SourceCodeText *this_00;
  string local_60;
  string local_40;
  string *local_20;
  string *text_local;
  string *name_local;
  
  local_20 = text;
  text_local = name;
  name_local = (string *)this;
  this_00 = (SourceCodeText *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  std::__cxx11::string::string((string *)&local_60,(string *)text);
  SourceCodeText(this_00,&local_40,&local_60,true);
  RefCountedPtr<soul::SourceCodeText>::RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)this,this_00);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return (Ptr)this;
}

Assistant:

SourceCodeText::Ptr SourceCodeText::createInternal (std::string name, std::string text)
{
    return Ptr (*new SourceCodeText (std::move (name), std::move (text), true));
}